

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericData.hpp
# Opt level: O2

void __thiscall
OpenMD::SimpleTypeData<OpenMD::MultipoleAtypeParameters>::~SimpleTypeData
          (SimpleTypeData<OpenMD::MultipoleAtypeParameters> *this)

{
  (this->super_GenericData)._vptr_GenericData = (_func_int **)&PTR__GenericData_002c0530;
  std::__cxx11::string::~string((string *)&(this->super_GenericData).id_);
  return;
}

Assistant:

SimpleTypeData(const std::string& id) :
        GenericData(id), data_(ElemDataType()) {}